

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_subgraph
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  DependenceGraph<dg::LLVMNode> *__range3;
  
  dumpSubgraphStart(this,sub,(char *)0x0);
  dumpBBs(this,sub,2);
  p_Var1 = &(sub->nodes)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (sub->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    dump_node(this,(LLVMNode *)p_Var2[1]._M_parent,2,(char *)0x0);
  }
  for (p_Var2 = (sub->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    dump_node_edges(this,(LLVMNode *)p_Var2[1]._M_parent,2);
  }
  dumpSubgraphEnd(this,sub,true);
  return;
}

Assistant:

void dump_subgraph(DependenceGraph<NodeT> *sub) {
        dumpSubgraphStart(sub);

#ifdef ENABLE_CFG
        // dump BBs in the subgraph
        dumpBBs(sub, 2);
#endif

        // dump all nodes again, if there is any that is
        // not in any BB
        for (auto &I : *sub)
            dump_node(I.second, 2);
        // dump edges between nodes
        for (auto &I : *sub)
            dump_node_edges(I.second, 2);

        dumpSubgraphEnd(sub);
    }